

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O3

double __thiscall chrono::ChSolverAPGD::Solve(ChSolverAPGD *this,ChSystemDescriptor *sysd)

{
  ChVectorDynamic<> *this_00;
  pointer ppCVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> eVar7;
  ChVectorDynamic<> *pCVar8;
  ChConstraint *pCVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  plainobjectbase_evaluator_data<double,_0> pVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int iVar25;
  ChVectorDynamic<> *pCVar26;
  pointer ppCVar27;
  Index index;
  ulong uVar28;
  pointer ppCVar29;
  char *pcVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  ChSystemDescriptor *pCVar34;
  plainobjectbase_evaluator_data<double,_0> pVar35;
  ulong uVar36;
  Index size;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  Scalar SVar41;
  double dVar42;
  Scalar SVar43;
  Scalar mdeltalambda;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 extraout_var [56];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 in_XMM4 [16];
  ActualDstType actualDst_2;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  ChVectorDynamic<> Minvk;
  scalar_sum_op<double,_double> local_181;
  ChVectorDynamic<> *local_180;
  double local_178;
  double local_170;
  ChVectorDynamic<> *local_168;
  ChVectorDynamic<> *local_160;
  double local_158;
  ChVectorDynamic<> *local_150;
  plainobjectbase_evaluator_data<double,_0> local_148;
  ChVectorDynamic<> *local_140;
  ChSystemDescriptor *local_138;
  Scalar local_130;
  undefined1 local_128 [16];
  plainobjectbase_evaluator_data<double,_0> local_118;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_110;
  scalar_constant_op<double> local_108;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_100;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_f8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_f0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_d8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_d0;
  undefined1 local_c8 [32];
  plainobjectbase_evaluator_data<double,_0> local_a8;
  scalar_constant_op<double> local_a0;
  variable_if_dynamic<long,__1> local_98;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> local_88;
  ChVectorDynamic<> *local_80;
  ChVectorDynamic<> *local_78;
  ChVectorDynamic<> *local_50;
  undefined1 local_48 [16];
  
  ppCVar27 = (sysd->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar27) {
    uVar36 = 0;
    uVar28 = 1;
    do {
      (*ppCVar27[uVar36]->_vptr_ChConstraint[6])();
      ppCVar27 = (sysd->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = uVar28 < (ulong)((long)(sysd->vconstraints).
                                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar27 >>
                               3);
      uVar36 = uVar28;
      uVar28 = (ulong)((int)uVar28 + 1);
    } while (bVar10);
  }
  iVar25 = (*sysd->_vptr_ChSystemDescriptor[8])(sysd);
  local_140 = &this->gamma_hat;
  this->nc = iVar25;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_140->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar25
            );
  this_00 = &this->gammaNew;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)this->nc
            );
  pCVar8 = &this->g;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)this->nc)
  ;
  local_160 = &this->y;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_160->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  local_168 = &this->yNew;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  local_50 = &this->r;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_50->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  local_180 = &this->tmp;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (long)this->nc);
  this->residual = 1e+31;
  ShurBvectorCompute(this,sysd);
  if (this->nc == 0) {
    local_180 = (ChVectorDynamic<> *)0x0;
  }
  else {
    local_48 = (undefined1  [16])0x0;
    local_150 = &this->gamma;
    (*sysd->_vptr_ChSystemDescriptor[0x10])(sysd,local_48,1);
    ppCVar27 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar29 = (sysd->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    local_138 = sysd;
    if ((this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_warm_start == false) {
      if ((long)ppCVar29 - (long)ppCVar27 != 0) {
        uVar36 = 0;
        do {
          ppCVar1 = ppCVar27 + uVar36;
          uVar36 = uVar36 + 1;
          (*ppCVar1)->l_i = 0.0;
        } while ((uVar36 & 0xffffffff) < (ulong)((long)ppCVar29 - (long)ppCVar27 >> 3));
      }
    }
    else if (ppCVar29 != ppCVar27) {
      uVar36 = 0;
      uVar28 = 1;
      do {
        if (ppCVar27[uVar36]->active == true) {
          (*ppCVar27[uVar36]->_vptr_ChConstraint[8])();
          ppCVar27 = (local_138->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar29 = (local_138->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        bVar10 = uVar28 < (ulong)((long)ppCVar29 - (long)ppCVar27 >> 3);
        uVar36 = uVar28;
        uVar28 = (ulong)((int)uVar28 + 1);
      } while (bVar10);
    }
    pCVar34 = local_138;
    (*local_138->_vptr_ChSystemDescriptor[0x12])(local_138,local_150,1);
    lVar32 = (this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (lVar32 < 0) {
LAB_007c02a1:
      pcVar30 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
LAB_007c012e:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar30);
    }
    if (lVar32 != 0) {
      auVar37 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar39 = vpbroadcastq_avx512f();
      lVar31 = 0;
      pdVar3 = (local_140->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
      do {
        auVar40 = vpbroadcastq_avx512f();
        auVar40 = vporq_avx512f(auVar40,auVar38);
        uVar36 = vpcmpuq_avx512f(auVar40,auVar39,2);
        pdVar4 = pdVar3 + lVar31;
        bVar10 = (bool)((byte)uVar36 & 1);
        bVar11 = (bool)((byte)(uVar36 >> 1) & 1);
        bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
        bVar13 = (bool)((byte)(uVar36 >> 3) & 1);
        bVar14 = (bool)((byte)(uVar36 >> 4) & 1);
        bVar15 = (bool)((byte)(uVar36 >> 5) & 1);
        bVar16 = (bool)((byte)(uVar36 >> 6) & 1);
        *pdVar4 = (double)((ulong)bVar10 * auVar37._0_8_ | (ulong)!bVar10 * (long)*pdVar4);
        pdVar4[1] = (double)((ulong)bVar11 * auVar37._8_8_ | (ulong)!bVar11 * (long)pdVar4[1]);
        pdVar4[2] = (double)((ulong)bVar12 * auVar37._16_8_ | (ulong)!bVar12 * (long)pdVar4[2]);
        pdVar4[3] = (double)((ulong)bVar13 * auVar37._24_8_ | (ulong)!bVar13 * (long)pdVar4[3]);
        pdVar4[4] = (double)((ulong)bVar14 * auVar37._32_8_ | (ulong)!bVar14 * (long)pdVar4[4]);
        pdVar4[5] = (double)((ulong)bVar15 * auVar37._40_8_ | (ulong)!bVar15 * (long)pdVar4[5]);
        pdVar4[6] = (double)((ulong)bVar16 * auVar37._48_8_ | (ulong)!bVar16 * (long)pdVar4[6]);
        pdVar4[7] = (double)((uVar36 >> 7) * auVar37._56_8_ |
                            (ulong)!SUB81(uVar36 >> 7,0) * (long)pdVar4[7]);
        lVar31 = lVar31 + 8;
      } while (((lVar32 + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(lVar32 + 0x1fffffffffffffffU) & 7) != lVar31);
    }
    pdVar3 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar36 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         != uVar36) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_160->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar36
                   ,1),
       (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
       uVar36)) {
LAB_007c01e0:
      pcVar30 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007c01d6:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar30);
    }
    uVar28 = uVar36 + 7;
    if (-1 < (long)uVar36) {
      uVar28 = uVar36;
    }
    uVar28 = uVar28 & 0xfffffffffffffff8;
    pdVar4 = (local_160->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    if (7 < (long)uVar36) {
      lVar32 = 0;
      do {
        auVar37 = vmovdqa64_avx512f(*(undefined1 (*) [64])(pdVar3 + lVar32));
        auVar37 = vmovdqa64_avx512f(auVar37);
        *(undefined1 (*) [64])(pdVar4 + lVar32) = auVar37;
        lVar32 = lVar32 + 8;
      } while (lVar32 < (long)uVar28);
    }
    if ((long)uVar28 < (long)uVar36) {
      do {
        pdVar4[uVar28] = pdVar3[uVar28];
        uVar28 = uVar28 + 1;
      } while (uVar36 != uVar28);
    }
    uVar36 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    local_148.data = (double *)pCVar8;
    if (uVar36 != (this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_rows) {
LAB_007c0171:
      pcVar30 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
      ;
LAB_007c01b4:
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,pcVar30);
    }
    pdVar3 = (this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    pdVar4 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    if (((this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         != uVar36) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar36
                   ,1),
       (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       != uVar36)) {
      pcVar30 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, T1 = double, T2 = double]"
      ;
      goto LAB_007c01d6;
    }
    pVar35.data = local_148.data;
    pdVar5 = (local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar28 = uVar36 + 7;
    if (-1 < (long)uVar36) {
      uVar28 = uVar36;
    }
    uVar28 = uVar28 & 0xfffffffffffffff8;
    if (7 < (long)uVar36) {
      lVar32 = 0;
      do {
        auVar37 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar4 + lVar32),
                                 *(undefined1 (*) [64])(pdVar3 + lVar32));
        *(undefined1 (*) [64])(pdVar5 + lVar32) = auVar37;
        lVar32 = lVar32 + 8;
      } while (lVar32 < (long)uVar28);
    }
    if ((long)uVar28 < (long)uVar36) {
      do {
        pdVar5[uVar28] = pdVar4[uVar28] - pdVar3[uVar28];
        uVar28 = uVar28 + 1;
      } while (uVar36 != uVar28);
    }
    local_128._0_8_ = local_180;
    lVar32 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (lVar32 == 0) {
      local_170 = 0.0;
    }
    else {
      if (lVar32 < 1) goto LAB_007c02bb;
      local_c8._8_8_ =
           (local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
      local_170 = Eigen::internal::
                  redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                  ::
                  run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                            ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)local_c8,&local_181,
                             (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                              *)local_128);
    }
    (*pCVar34->_vptr_ChSystemDescriptor[0x16])(pCVar34,local_168,local_180,0);
    local_128._0_8_ = local_168;
    lVar32 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (lVar32 == 0) {
      dVar42 = 0.0;
    }
    else {
      if (lVar32 < 1) {
LAB_007c02bb:
        pcVar30 = 
        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
        ;
LAB_007c02d0:
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,pcVar30);
      }
      local_c8._8_8_ =
           (local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
      auVar37._0_8_ =
           Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_c8,&local_181,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_128);
      auVar37._8_56_ = extraout_var;
      lVar32 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_rows;
      if (lVar32 < 0) goto LAB_007c02a1;
      auVar18 = vsqrtsd_avx(auVar37._0_16_,auVar37._0_16_);
      dVar42 = auVar18._0_8_;
      if (lVar32 != 0) {
        local_178 = auVar18._0_8_;
        memset((local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data,0,lVar32 << 3);
        dVar42 = local_178;
      }
    }
    (this->super_ChIterativeSolverVI).m_iterations = 0;
    if (0 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations) {
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_170;
      auVar18 = vsqrtsd_avx(in_XMM4,auVar18);
      local_170 = dVar42 / auVar18._0_8_;
      local_158 = 1.0;
      do {
        (*pCVar34->_vptr_ChSystemDescriptor[0x16])(pCVar34,pVar35.data,local_160,0);
        uVar36 = (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
        if (uVar36 != (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) {
          pcVar30 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c01b4;
        }
        if ((long)uVar36 < 0) {
LAB_007c0119:
          pcVar30 = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c012e;
        }
        if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != uVar36) {
          pcVar30 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>]"
          ;
          goto LAB_007c01b4;
        }
        pdVar3 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pdVar4 = (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        pdVar5 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data;
        if (((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows != uVar36) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       uVar36,1),
           (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
           .m_rows != uVar36)) {
          pcVar30 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007c01d6;
        }
        pCVar34 = local_138;
        pdVar6 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        auVar44._0_8_ = 1.0 / local_170;
        auVar44._8_8_ = 0;
        uVar28 = uVar36 & 0x7ffffffffffffff8;
        if (7 < uVar36) {
          auVar37 = vbroadcastsd_avx512f(auVar44);
          uVar33 = 0;
          do {
            auVar38 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar4 + uVar33),
                                     *(undefined1 (*) [64])(pdVar5 + uVar33));
            auVar38 = vmulpd_avx512f(auVar37,auVar38);
            auVar38 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar3 + uVar33),auVar38);
            *(undefined1 (*) [64])(pdVar6 + uVar33) = auVar38;
            uVar33 = uVar33 + 8;
          } while (uVar33 < uVar28);
        }
        if ((long)uVar28 < (long)uVar36) {
          do {
            pdVar6[uVar28] = pdVar3[uVar28] - auVar44._0_8_ * (pdVar4[uVar28] + pdVar5[uVar28]);
            uVar28 = uVar28 + 1;
          } while (uVar36 != uVar28);
        }
        (*local_138->_vptr_ChSystemDescriptor[0x18])(local_138,this_00);
        pCVar26 = local_50;
        pVar35.data = local_148.data;
        pCVar8 = local_160;
        (*pCVar34->_vptr_ChSystemDescriptor[0x16])(pCVar34,local_180,this_00,0);
        pdVar3 = (double *)
                 (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)pdVar3 < 0) goto LAB_007c0119;
        if (pdVar3 != (double *)
                      (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) {
LAB_007c015a:
          pcVar30 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_007c01b4;
        }
        if ((double *)
            (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows != pdVar3) {
LAB_007c0138:
          pcVar30 = 
          "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
          ;
LAB_007c014d:
          __assert_fail("size() == other.size()","/usr/include/eigen3/Eigen/src/Core/Dot.h",0x52,
                        pcVar30);
        }
        local_a0.m_other = 0.5;
        local_98.m_value = (long)local_180;
        local_88.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)pCVar26;
        local_c8._0_8_ = this_00;
        local_c8._24_8_ = pdVar3;
        if (pdVar3 == (double *)0x0) {
          local_178 = 0.0;
        }
        else {
          local_128._8_8_ =
               (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
          local_108.m_other = 0.5;
          local_f8.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
          local_f0.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
          local_178 = Eigen::internal::
                      redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                      ::
                      run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                  *)local_128,&local_181,
                                 (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                  *)local_c8);
        }
        (*pCVar34->_vptr_ChSystemDescriptor[0x16])(pCVar34,local_180,pCVar8,0);
        pdVar3 = (double *)
                 (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if ((long)pdVar3 < 0) goto LAB_007c0119;
        if (pdVar3 != (double *)
                      (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) goto LAB_007c015a;
        if ((double *)
            (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != pdVar3) goto LAB_007c0138;
        local_c8._0_8_ = pCVar8;
        local_a0.m_other = 0.5;
        local_98.m_value = (long)local_180;
        local_88.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)pCVar26;
        local_c8._24_8_ = pdVar3;
        if (pdVar3 == (double *)0x0) {
          if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != 0) goto LAB_007c0171;
          SVar41 = 0.0;
          pCVar26 = (ChVectorDynamic<> *)0x0;
        }
        else {
          local_128._8_8_ =
               (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
          local_108.m_other = 0.5;
          local_f8.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
          local_f0.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
          SVar41 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_128,&local_181,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_c8);
          pCVar26 = (ChVectorDynamic<> *)
                    (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
          if ((ChVectorDynamic<> *)
              (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != pCVar26) goto LAB_007c0171;
          if ((long)pCVar26 < 0) goto LAB_007c0119;
        }
        pVar17.data = (double *)(local_170 * 0.5);
        if ((ChVectorDynamic<> *)
            (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != pCVar26) {
LAB_007c0188:
          pcVar30 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>]"
          ;
          goto LAB_007c01b4;
        }
        local_c8._16_8_ = pCVar8;
        local_a8.data = pVar35.data;
        local_78 = pCVar8;
        local_98.m_value = (long)pCVar26;
        local_88.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)pVar17.data;
        if (pCVar26 == (ChVectorDynamic<> *)0x0) goto LAB_007bf7f3;
        local_118.data =
             (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_110.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
        local_100.m_d.data = (plainobjectbase_evaluator_data<double,_0>)*pVar35.data;
        local_130 = SVar41;
        local_f0.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)pVar17.data;
        local_d8.m_d.data =
             (plainobjectbase_evaluator_data<double,_0>)
             (plainobjectbase_evaluator_data<double,_0>)local_118.data;
        local_d0.m_d.data = local_110.m_d.data;
        local_c8._8_8_ = this_00;
        local_80 = this_00;
        dVar42 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const>const>>,3,0>
                 ::
                 run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>>
                           ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
                             *)local_128,&local_181,
                            (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                             *)local_c8);
        SVar41 = local_130;
        while (SVar41 + dVar42 <= local_178) {
          uVar36 = (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((long)uVar36 < 0) goto LAB_007c0119;
          if ((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != uVar36) {
            pcVar30 = 
            "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>]"
            ;
            goto LAB_007c01b4;
          }
          pdVar3 = (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          pdVar4 = (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          if (((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows != uVar36) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                         uVar36,1),
             (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows != uVar36)) {
            pcVar30 = 
            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
            ;
            goto LAB_007c01d6;
          }
          pdVar5 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          uVar28 = uVar36 & 0x7ffffffffffffff8;
          local_170 = local_170 + local_170;
          auVar45._0_8_ = 1.0 / local_170;
          auVar45._8_8_ = 0;
          if (7 < uVar36) {
            auVar37 = vbroadcastsd_avx512f(auVar45);
            uVar33 = 0;
            do {
              auVar38 = vmulpd_avx512f(auVar37,*(undefined1 (*) [64])(pdVar4 + uVar33));
              auVar38 = vsubpd_avx512f(*(undefined1 (*) [64])(pdVar3 + uVar33),auVar38);
              *(undefined1 (*) [64])(pdVar5 + uVar33) = auVar38;
              uVar33 = uVar33 + 8;
            } while (uVar33 < uVar28);
          }
          if ((long)uVar28 < (long)uVar36) {
            do {
              pdVar5[uVar28] = pdVar3[uVar28] - auVar45._0_8_ * pdVar4[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar36 != uVar28);
          }
          (*pCVar34->_vptr_ChSystemDescriptor[0x18])(pCVar34,this_00);
          pCVar26 = local_50;
          pVar35.data = local_148.data;
          pCVar8 = local_160;
          eVar7.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)local_148.data;
          (*pCVar34->_vptr_ChSystemDescriptor[0x16])(pCVar34,local_180,this_00,0);
          pdVar3 = (double *)
                   (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((long)pdVar3 < 0) goto LAB_007c0119;
          if (pdVar3 != (double *)
                        (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows) goto LAB_007c015a;
          if ((double *)
              (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows != pdVar3) goto LAB_007c0138;
          local_a0.m_other = 0.5;
          local_98.m_value = (long)local_180;
          local_88.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)pCVar26;
          local_c8._24_8_ = pdVar3;
          if (pdVar3 == (double *)0x0) {
            local_178 = 0.0;
            local_c8._0_8_ = this_00;
          }
          else {
            local_128._8_8_ =
                 (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            local_108.m_other = 0.5;
            local_f8.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
            local_f0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            local_c8._0_8_ = this_00;
            local_178 = Eigen::internal::
                        redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                        ::
                        run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                  ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                    *)local_128,&local_181,
                                   (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                    *)local_c8);
          }
          (*pCVar34->_vptr_ChSystemDescriptor[0x16])(pCVar34,local_180,pCVar8,0);
          pdVar3 = (double *)
                   (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if ((long)pdVar3 < 0) goto LAB_007c0119;
          if (pdVar3 != (double *)
                        (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows) goto LAB_007c015a;
          if ((double *)
              (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != pdVar3) goto LAB_007c0138;
          local_c8._0_8_ = pCVar8;
          local_a0.m_other = 0.5;
          local_98.m_value = (long)local_180;
          local_88.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)pCVar26;
          local_c8._24_8_ = pdVar3;
          if (pdVar3 == (double *)0x0) {
            if ((this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != 0) goto LAB_007c0171;
            SVar41 = 0.0;
            pCVar26 = (ChVectorDynamic<> *)0x0;
          }
          else {
            local_128._8_8_ =
                 (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
            local_108.m_other = 0.5;
            local_f8.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (local_180->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
            local_f0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (pCVar26->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            SVar41 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                 *)local_128,&local_181,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)local_c8);
            pCVar26 = (ChVectorDynamic<> *)
                      (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows;
            if ((ChVectorDynamic<> *)
                (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows != pCVar26) goto LAB_007c0171;
            if ((long)pCVar26 < 0) goto LAB_007c0119;
          }
          pVar17.data = (double *)(local_170 * 0.5);
          if ((ChVectorDynamic<> *)
              (this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows != pCVar26) goto LAB_007c0188;
          local_c8._16_8_ = pCVar8;
          local_a8.data = pVar35.data;
          local_78 = pCVar8;
          local_98.m_value = (long)pCVar26;
          local_88.m_d.data =
               (plainobjectbase_evaluator_data<double,_0>)
               (plainobjectbase_evaluator_data<double,_0>)pVar17.data;
          if (pCVar26 == (ChVectorDynamic<> *)0x0) {
LAB_007bf7f3:
            dVar42 = 0.0;
            local_c8._8_8_ = this_00;
            local_c8._16_8_ = local_78;
            local_80 = this_00;
          }
          else {
            local_118.data =
                 (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            local_110.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
            local_100.m_d.data = (plainobjectbase_evaluator_data<double,_0>)*pVar35.data;
            local_130 = SVar41;
            local_f0.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)pVar17.data;
            local_d8.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (plainobjectbase_evaluator_data<double,_0>)local_118.data;
            local_d0.m_d.data = local_110.m_d.data;
            local_c8._8_8_ = this_00;
            local_80 = this_00;
            dVar42 = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const>const>>,3,0>
                     ::
                     run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>const>>
                               ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>_>
                                 *)local_128,&local_181,
                                (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                                 *)local_c8);
            SVar41 = local_130;
          }
        }
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_158;
        uVar36 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        auVar18 = vfmadd213sd_fma(auVar48,auVar48,ZEXT816(0x4010000000000000));
        auVar18 = vsqrtsd_avx(auVar18,auVar18);
        auVar46._8_8_ = 0;
        auVar46._0_8_ = local_158 * auVar18._0_8_;
        auVar18 = vfnmadd231sd_fma(auVar46,auVar48,auVar48);
        local_178 = auVar18._0_8_ * 0.5;
        if (uVar36 != (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) goto LAB_007c0171;
        if ((long)uVar36 < 0) goto LAB_007c0119;
        pdVar3 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar4 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        if (((this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows != uVar36) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       uVar36,1),
           (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows != uVar36)) {
          pcVar30 = 
          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>, T1 = double, T2 = double]"
          ;
          goto LAB_007c01d6;
        }
        pCVar34 = local_138;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = local_158;
        uVar28 = uVar36 & 0x7ffffffffffffff8;
        pdVar5 = (local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_178;
        auVar18 = vfmadd213sd_fma(auVar49,auVar49,auVar2);
        auVar47._0_8_ = (local_158 * (1.0 - local_158)) / auVar18._0_8_;
        auVar47._8_8_ = 0;
        if (7 < uVar36) {
          auVar37 = vbroadcastsd_avx512f(auVar47);
          uVar33 = 0;
          do {
            auVar38 = *(undefined1 (*) [64])(pdVar3 + uVar33);
            auVar39 = vsubpd_avx512f(auVar38,*(undefined1 (*) [64])(pdVar4 + uVar33));
            auVar39 = vmulpd_avx512f(auVar37,auVar39);
            auVar38 = vaddpd_avx512f(auVar38,auVar39);
            *(undefined1 (*) [64])(pdVar5 + uVar33) = auVar38;
            uVar33 = uVar33 + 8;
          } while (uVar33 < uVar28);
        }
        if ((long)uVar28 < (long)uVar36) {
          do {
            dVar42 = pdVar3[uVar28];
            pdVar5[uVar28] = dVar42 + auVar47._0_8_ * (dVar42 - pdVar4[uVar28]);
            uVar28 = uVar28 + 1;
          } while (uVar36 != uVar28);
        }
        dVar42 = Res4(this,local_138);
        pVar35.data = local_148.data;
        if (dVar42 < this->residual) {
          this->residual = dVar42;
          pdVar3 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          uVar36 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (((this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows != uVar36) &&
             (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_140->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                         uVar36,1),
             (this->gamma_hat).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows != uVar36)) goto LAB_007c01e0;
          uVar28 = uVar36 + 7;
          if (-1 < (long)uVar36) {
            uVar28 = uVar36;
          }
          uVar28 = uVar28 & 0xfffffffffffffff8;
          pdVar4 = (local_140->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          if (7 < (long)uVar36) {
            lVar32 = 0;
            do {
              pdVar5 = pdVar3 + lVar32;
              dVar42 = pdVar5[1];
              dVar19 = pdVar5[2];
              dVar20 = pdVar5[3];
              dVar21 = pdVar5[4];
              dVar22 = pdVar5[5];
              dVar23 = pdVar5[6];
              dVar24 = pdVar5[7];
              pdVar6 = pdVar4 + lVar32;
              *pdVar6 = *pdVar5;
              pdVar6[1] = dVar42;
              pdVar6[2] = dVar19;
              pdVar6[3] = dVar20;
              pdVar6[4] = dVar21;
              pdVar6[5] = dVar22;
              pdVar6[6] = dVar23;
              pdVar6[7] = dVar24;
              lVar32 = lVar32 + 8;
            } while (lVar32 < (long)uVar28);
          }
          if ((long)uVar28 < (long)uVar36) {
            do {
              pdVar4[uVar28] = pdVar3[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar36 != uVar28);
          }
        }
        if (this->residual < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_tolerance)
        break;
        lVar32 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if (lVar32 != (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) goto LAB_007c0171;
        if ((this->g).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != lVar32) {
          pcVar30 = 
          "typename ScalarBinaryOpTraits<typename internal::traits<Derived>::Scalar, typename internal::traits<OtherDerived>::Scalar>::ReturnType Eigen::MatrixBase<Eigen::Matrix<double, -1, 1>>::dot(const MatrixBase<OtherDerived> &) const [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>]"
          ;
          goto LAB_007c014d;
        }
        local_128._0_8_ = pVar35.data;
        local_118.data = (double *)local_150;
        dVar42 = local_178;
        local_128._8_8_ = this_00;
        if (lVar32 != 0) {
          if (lVar32 < 1) {
            pcVar30 = 
            "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
            ;
            goto LAB_007c02d0;
          }
          local_c8._8_8_ =
               (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pVar35.data)->m_storage
               ).m_data;
          local_c8._24_8_ =
               (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
          local_a8.data =
               (local_150->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
               .m_data;
          SVar43 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                             ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                               *)local_c8,&local_181,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)local_128);
          local_158 = local_178;
          dVar42 = local_158;
          if (0.0 < SVar43) {
            pdVar3 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_data;
            uVar36 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     .m_storage.m_rows;
            if (((this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows != uVar36) &&
               (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&local_168->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar36,1)
               , (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows != uVar36)) goto LAB_007c01e0;
            uVar28 = uVar36 + 7;
            if (-1 < (long)uVar36) {
              uVar28 = uVar36;
            }
            uVar28 = uVar28 & 0xfffffffffffffff8;
            pdVar4 = (local_168->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            if (7 < (long)uVar36) {
              lVar32 = 0;
              do {
                pdVar5 = pdVar3 + lVar32;
                dVar42 = pdVar5[1];
                dVar19 = pdVar5[2];
                dVar20 = pdVar5[3];
                dVar21 = pdVar5[4];
                dVar22 = pdVar5[5];
                dVar23 = pdVar5[6];
                dVar24 = pdVar5[7];
                pdVar6 = pdVar4 + lVar32;
                *pdVar6 = *pdVar5;
                pdVar6[1] = dVar42;
                pdVar6[2] = dVar19;
                pdVar6[3] = dVar20;
                pdVar6[4] = dVar21;
                pdVar6[5] = dVar22;
                pdVar6[6] = dVar23;
                pdVar6[7] = dVar24;
                lVar32 = lVar32 + 8;
              } while (lVar32 < (long)uVar28);
            }
            local_158 = 1.0;
            dVar42 = local_158;
            if ((long)uVar28 < (long)uVar36) {
              do {
                pdVar4[uVar28] = pdVar3[uVar28];
                uVar28 = uVar28 + 1;
              } while (uVar36 != uVar28);
              dVar42 = 1.0;
            }
          }
        }
        local_158 = dVar42;
        uVar36 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        uVar28 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        local_170 = local_170 * 0.9;
        if ((this->super_ChIterativeSolverVI).record_violation_history == true) {
          if (uVar36 != uVar28) goto LAB_007c0171;
          dVar42 = this->residual;
          if (uVar36 == 0) {
            mdeltalambda = 0.0;
          }
          else {
            local_c8._16_8_ = local_150;
            local_178 = dVar42;
            if ((long)uVar36 < 1) {
              pcVar30 = 
              "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>>, BinaryOp = Eigen::internal::scalar_max_op<double>]"
              ;
              local_c8._8_8_ = this_00;
              goto LAB_007c02d0;
            }
            local_118.data =
                 (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
            local_110.m_d.data =
                 (plainobjectbase_evaluator_data<double,_0>)
                 (local_150->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
            local_c8._8_8_ = this_00;
            mdeltalambda = Eigen::internal::
                           redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                       *)local_128,(scalar_max_op<double,_double,_0> *)&local_181,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)local_c8);
            dVar42 = local_178;
          }
          ChIterativeSolverVI::AtIterationEnd
                    (&this->super_ChIterativeSolverVI,dVar42,mdeltalambda,
                     (this->super_ChIterativeSolverVI).m_iterations);
          uVar36 = (this->gammaNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          uVar28 = (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
        }
        pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_data;
        if ((uVar28 != uVar36) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_150->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       uVar36,1),
           (this->gamma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows != uVar36)) goto LAB_007c01e0;
        uVar28 = uVar36 + 7;
        if (-1 < (long)uVar36) {
          uVar28 = uVar36;
        }
        uVar28 = uVar28 & 0xfffffffffffffff8;
        pdVar4 = (local_150->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        if (7 < (long)uVar36) {
          lVar32 = 0;
          do {
            auVar37 = vmovdqa64_avx512f(*(undefined1 (*) [64])(pdVar3 + lVar32));
            auVar37 = vmovdqa64_avx512f(auVar37);
            *(undefined1 (*) [64])(pdVar4 + lVar32) = auVar37;
            lVar32 = lVar32 + 8;
          } while (lVar32 < (long)uVar28);
        }
        if ((long)uVar28 < (long)uVar36) {
          do {
            pdVar4[uVar28] = pdVar3[uVar28];
            uVar28 = uVar28 + 1;
          } while (uVar36 != uVar28);
        }
        pdVar3 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar36 = (this->yNew).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows;
        if (((this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows != uVar36) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_160->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                       uVar36,1),
           (this->y).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           != uVar36)) goto LAB_007c01e0;
        uVar28 = uVar36 + 7;
        if (-1 < (long)uVar36) {
          uVar28 = uVar36;
        }
        uVar28 = uVar28 & 0xfffffffffffffff8;
        pdVar4 = (local_160->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        if (7 < (long)uVar36) {
          lVar32 = 0;
          do {
            auVar37 = vmovdqa64_avx512f(*(undefined1 (*) [64])(pdVar3 + lVar32));
            auVar37 = vmovdqa64_avx512f(auVar37);
            *(undefined1 (*) [64])(pdVar4 + lVar32) = auVar37;
            lVar32 = lVar32 + 8;
          } while (lVar32 < (long)uVar28);
        }
        if ((long)uVar28 < (long)uVar36) {
          do {
            pdVar4[uVar28] = pdVar3[uVar28];
            uVar28 = uVar28 + 1;
          } while (uVar36 != uVar28);
        }
        iVar25 = (this->super_ChIterativeSolverVI).m_iterations + 1;
        (this->super_ChIterativeSolverVI).m_iterations = iVar25;
      } while (iVar25 < (this->super_ChIterativeSolverVI).super_ChIterativeSolver.m_max_iterations);
    }
    (*pCVar34->_vptr_ChSystemDescriptor[0x13])(pCVar34,local_140);
    (*pCVar34->_vptr_ChSystemDescriptor[0x11])(pCVar34,local_48);
    ppCVar27 = (pCVar34->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar29 = (pCVar34->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar29 != ppCVar27) {
      uVar36 = 0;
      do {
        pCVar9 = ppCVar27[uVar36];
        if (pCVar9->active == true) {
          (*pCVar9->_vptr_ChConstraint[8])(pCVar9->l_i);
          ppCVar27 = (pCVar34->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppCVar29 = (pCVar34->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar36 = uVar36 + 1;
      } while (uVar36 < (ulong)((long)ppCVar29 - (long)ppCVar27 >> 3));
    }
    local_180 = (ChVectorDynamic<> *)this->residual;
    if (local_48._0_8_ != 0) {
      free(*(void **)(local_48._0_8_ + -8));
    }
  }
  return (double)local_180;
}

Assistant:

double ChSolverAPGD::Solve(ChSystemDescriptor& sysd) {
    bool verbose = false;
    const std::vector<ChConstraint*>& mconstraints = sysd.GetConstraintsList();
    const std::vector<ChVariables*>& mvariables = sysd.GetVariablesList();
    if (verbose)
        std::cout << "Number of constraints: " << mconstraints.size()
                  << "\nNumber of variables  : " << mvariables.size() << std::endl;

    // Update auxiliary data in all constraints before starting,
    // that is: g_i=[Cq_i]*[invM_i]*[Cq_i]' and  [Eq_i]=[invM_i]*[Cq_i]'
    for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
        mconstraints[ic]->Update_auxiliary();

    double L, t;
    double theta;
    double thetaNew;
    double Beta;
    double obj1, obj2;

    nc = sysd.CountActiveConstraints();
    gamma_hat.resize(nc);
    gammaNew.resize(nc);
    g.resize(nc);
    y.resize(nc);
    gamma.resize(nc);
    yNew.resize(nc);
    r.resize(nc);
    tmp.resize(nc);

    residual = 10e30;

    Beta = 0.0;
    obj1 = 0.0;
    obj2 = 0.0;

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    ShurBvectorCompute(sysd);

    // If no constraints, return now. Variables contain M^-1 * f after call to ShurBvectorCompute.
    // This early exit is needed, else we get division by zero and a potential infinite loop.
    if (nc == 0) {
        return 0;
    }

    // Optimization: backup the  q  sparse data computed above,
    // because   (M^-1)*k   will be needed at the end when computing primals.
    ChVectorDynamic<> Minvk;
    sysd.FromVariablesToVector(Minvk, true);

    // (1) gamma_0 = zeros(nc,1)
    if (m_warm_start) {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            if (mconstraints[ic]->IsActive())
                mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    } else {
        for (unsigned int ic = 0; ic < mconstraints.size(); ic++)
            mconstraints[ic]->Set_l_i(0.);
    }
    sysd.FromConstraintsToVector(gamma);

    // (2) gamma_hat_0 = ones(nc,1)
    gamma_hat.setConstant(1.0);

    // (3) y_0 = gamma_0
    y = gamma;

    // (4) theta_0 = 1
    theta = 1.0;

    // (5) L_k = norm(N * (gamma_0 - gamma_hat_0)) / norm(gamma_0 - gamma_hat_0)
    tmp = gamma - gamma_hat;
    L = tmp.norm();
    sysd.ShurComplementProduct(yNew, tmp, nullptr);  // yNew = N * tmp = N * (gamma - gamma_hat)
    L = yNew.norm() / L;
    yNew.setZero();  //// RADU  is this really necessary here?

    // (6) t_k = 1 / L_k
    t = 1.0 / L;

    //// RADU
    //// Check correctness (e.g. sign of 'r' in comments vs. code)

    // (7) for k := 0 to N_max
    for (m_iterations = 0; m_iterations < m_max_iterations; m_iterations++) {
        // (8) g = N * y_k - r
        // (9) gamma_(k+1) = ProjectionOperator(y_k - t_k * g)
        sysd.ShurComplementProduct(g, y);  // g = N * y
        gammaNew = y - t * (g + r);
        sysd.ConstraintsProject(gammaNew);

        // (10) while 0.5 * gamma_(k+1)' * N * gamma_(k+1) - gamma_(k+1)' * r >=
        //            0.5 * y_k' * N * y_k - y_k' * r + g' * (gamma_(k+1) - y_k) + 0.5 * L_k * norm(gamma_(k+1) - y_k)^2
        sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew;
        obj1 = gammaNew.dot(0.5 * tmp + r);

        sysd.ShurComplementProduct(tmp, y);  // tmp = N * y;
        obj2 = y.dot(0.5 * tmp + r) + (gammaNew - y).dot(g + 0.5 * L * (gammaNew - y));

        while (obj1 >= obj2) {
            // (11) L_k = 2 * L_k
            L = 2.0 * L;

            // (12) t_k = 1 / L_k
            t = 1.0 / L;

            // (13) gamma_(k+1) = ProjectionOperator(y_k - t_k * g)
            gammaNew = y - t * g;
            sysd.ConstraintsProject(gammaNew);

            // Update obj1 and obj2
            sysd.ShurComplementProduct(tmp, gammaNew);  // tmp = N * gammaNew;
            obj1 = gammaNew.dot(0.5 * tmp + r);

            sysd.ShurComplementProduct(tmp, y);  // tmp = N * y;
            obj2 = y.dot(0.5 * tmp + r) + (gammaNew - y).dot(g + 0.5 * L * (gammaNew - y));
        }  // (14) endwhile

        // (15) theta_(k+1) = (-theta_k^2 + theta_k * sqrt(theta_k^2 + 4)) / 2
        thetaNew = (-theta * theta + theta * sqrt(theta * theta + 4.0)) / 2.0;

        // (16) Beta_(k+1) = theta_k * (1 - theta_k) / (theta_k^2 + theta_(k+1))
        Beta = theta * (1.0 - theta) / (theta * theta + thetaNew);

        // (17) y_(k+1) = gamma_(k+1) + Beta_(k+1) * (gamma_(k+1) - gamma_k)
        yNew = gammaNew + Beta * (gammaNew - gamma);

        // (18) r = r(gamma_(k+1))
        double res = Res4(sysd);

        if (res < residual) {      // (19) if r < epsilon_min
            residual = res;        // (20) r_min = r
            gamma_hat = gammaNew;  // (21) gamma_hat = gamma_(k+1)
        }                          // (22) endif

        if (residual < m_tolerance) {  // (23) if r < Tau
            break;                         // (24) break
        }                                  // (25) endif

        if (g.dot(gammaNew - gamma) > 0) {  // (26) if g' * (gamma_(k+1) - gamma_k) > 0
            yNew = gammaNew;                // (27) y_(k+1) = gamma_(k+1)
            thetaNew = 1.0;                 // (28) theta_(k+1) = 1
        }                                   // (29) endif

        // (30) L_k = 0.9 * L_k
        L = 0.9 * L;

        // (31) t_k = 1 / L_k
        t = 1.0 / L;

        // perform some tasks at the end of the iteration
        if (this->record_violation_history) {
            AtIterationEnd(residual, (gammaNew - gamma).lpNorm<Eigen::Infinity>(), m_iterations);
        }

        // Update iterates
        theta = thetaNew;
        gamma = gammaNew;
        y = yNew;
    }  // (32) endfor

    if (verbose)
        std::cout << "Residual: " << residual << ", Iter: " << m_iterations << std::endl;

    // (33) return Value at time step t_(l+1), gamma_(l+1) := gamma_hat
    sysd.FromVectorToConstraints(gamma_hat);

    // Resulting PRIMAL variables:
    // compute the primal variables as   v = (M^-1)(k + D*l)
    // v = (M^-1)*k  ...    (by rewinding to the backup vector computed at the beginning)
    sysd.FromVectorToVariables(Minvk);

    // ... + (M^-1)*D*l     (this increment and also stores 'qb' in the ChVariable items)
    for (size_t ic = 0; ic < mconstraints.size(); ic++) {
        if (mconstraints[ic]->IsActive())
            mconstraints[ic]->Increment_q(mconstraints[ic]->Get_l_i());
    }

    return residual;
}